

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_codecs.c
# Opt level: O1

int cram_external_decode_char
              (cram_slice *slice,cram_codec *c,cram_block *in,char *out,int *out_size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  cram_block *pcVar5;
  ulong uVar6;
  
  if (slice->block_by_id == (cram_block **)0x0) {
    uVar1 = slice->hdr->num_blocks;
    if ((int)uVar1 < 1) {
      uVar6 = 0;
      pcVar5 = (cram_block *)0x0;
    }
    else {
      uVar6 = 0;
      do {
        pcVar5 = slice->block[uVar6];
        if (((pcVar5 != (cram_block *)0x0) && (pcVar5->content_type == EXTERNAL)) &&
           (pcVar5->content_id == (c->field_6).huffman.ncodes)) goto LAB_0014203d;
        uVar6 = uVar6 + 1;
      } while (uVar1 != uVar6);
      uVar6 = (ulong)uVar1;
    }
LAB_0014203d:
    if ((uint)uVar6 == uVar1) {
      return -1;
    }
    if (pcVar5 == (cram_block *)0x0) {
      return -1;
    }
  }
  else {
    pcVar5 = slice->block_by_id[(c->field_6).huffman.ncodes];
    if (pcVar5 == (cram_block *)0x0) {
      return -(uint)(*out_size != 0);
    }
  }
  iVar2 = pcVar5->idx;
  iVar3 = *out_size + iVar2;
  pcVar5->idx = iVar3;
  iVar4 = -1;
  if (pcVar5->data != (uchar *)0x0 && iVar3 <= pcVar5->uncomp_size) {
    memcpy(out,pcVar5->data + iVar2,(long)*out_size);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int cram_external_decode_char(cram_slice *slice, cram_codec *c,
			      cram_block *in, char *out,
			      int *out_size) {
    int i;
    char *cp;
    cram_block *b = NULL;

    /* Find the external block */
    if (slice->block_by_id) {
	if (!(b = slice->block_by_id[c->external.content_id]))
	    return *out_size?-1:0;
    } else {
	for (i = 0; i < slice->hdr->num_blocks; i++) {
	    b = slice->block[i];
	    if (b && b->content_type == EXTERNAL &&
		b->content_id == c->external.content_id) {
		break;
	    }
	}
	if (i == slice->hdr->num_blocks || !b)
	    return -1;
    }

    cp = cram_extract_block(b, *out_size);
    if (!cp)
	return -1;

    memcpy(out, cp, *out_size);
    return 0;
}